

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlReportText.cpp
# Opt level: O0

string * __thiscall
oout::XmlReportText::asString_abi_cxx11_(string *__return_storage_ptr__,XmlReportText *this)

{
  size_t sVar1;
  ostream *poVar2;
  element_type *peVar3;
  string local_1e0 [32];
  FmtJunitXml local_1c0;
  FmtJunitXml format;
  ostringstream out;
  CountFailure local_30;
  size_t local_20;
  size_t failure_count;
  XmlReportText *this_local;
  
  failure_count = (size_t)this;
  this_local = (XmlReportText *)__return_storage_ptr__;
  CountFailure::CountFailure(&local_30,&this->result);
  sVar1 = CountFailure::count(&local_30);
  CountFailure::~CountFailure(&local_30);
  local_20 = sVar1;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&format);
  poVar2 = std::operator<<((ostream *)&format,"<?xml version=\'1.0\' encoding=\'UTF-8\'?>");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&format,"<testsuites ");
  poVar2 = std::operator<<(poVar2,"errors=\'");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_20);
  poVar2 = std::operator<<(poVar2,"\' ");
  poVar2 = std::operator<<(poVar2,"failures=\'");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_20);
  poVar2 = std::operator<<(poVar2,"\'>");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  FmtJunitXml::FmtJunitXml(&local_1c0);
  peVar3 = std::__shared_ptr_access<const_oout::Result,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_oout::Result,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->result);
  (*peVar3->_vptr_Result[2])(local_1e0,peVar3,&local_1c0);
  std::operator<<((ostream *)&format,local_1e0);
  std::__cxx11::string::~string(local_1e0);
  poVar2 = std::operator<<((ostream *)&format,"</testsuites>");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::ostringstream::str();
  FmtJunitXml::~FmtJunitXml(&local_1c0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&format);
  return __return_storage_ptr__;
}

Assistant:

string XmlReportText::asString() const
{
	const auto failure_count = CountFailure(result).count();

	ostringstream out;
	out << "<?xml version='1.0' encoding='UTF-8'?>" << endl;
	out << "<testsuites "
	    << "errors='" << failure_count << "' "
	    << "failures='" << failure_count << "'>"
	    << endl;

	FmtJunitXml format;
	out << result->print(format);

	out << "</testsuites>" << endl;
	return out.str();
}